

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

int dosave(void)

{
  char cVar1;
  
  cVar1 = yn_function("Really save?","yn",'n');
  if (cVar1 == 'n') {
    if (0 < multi) {
      nomul(0,(char *)0x0);
    }
    return 0;
  }
  pline("Saving...");
  dosave0('\0');
  program_state.something_worth_saving = 0;
  u.uhp = -1;
  terminate();
}

Assistant:

int dosave(void)
{
	if (yn("Really save?") == 'n') {
		if (multi > 0) nomul(0, NULL);
	} else {
		pline("Saving...");
		if (dosave0(FALSE)) {
			program_state.something_worth_saving = 0;
			u.uhp = -1;		/* universal game's over indicator */
			terminate();
		} else doredraw();
	}
	return 0;
}